

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

basic_substring<char> __thiscall
c4::basic_substring<char>::trimr(basic_substring<char> *this,ro_substr chars)

{
  ulong uVar1;
  code *pcVar2;
  char *pcVar3;
  bool bVar4;
  size_t sVar5;
  size_t len_;
  basic_substring<char> bVar6;
  basic_substring<char> local_20;
  
  pcVar3 = this->str;
  if (this->str != (char *)0x0 && this->len != 0) {
    sVar5 = last_not_of(this,chars,0xffffffffffffffff);
    if (sVar5 != 0xffffffffffffffff) {
      len_ = sVar5 + 1;
      uVar1 = this->len;
      if (len_ != 0xffffffffffffffff && uVar1 <= sVar5) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            bVar6 = (basic_substring<char>)(*pcVar2)();
            return bVar6;
          }
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153b,"(num >= 0 && num <= len) || (num == npos)");
      }
      if (len_ == 0xffffffffffffffff) {
        len_ = uVar1;
      }
      if (uVar1 < len_) {
        if (((byte)s_error_flags & 1) != 0) {
          bVar4 = is_debugger_attached();
          if (bVar4) {
            pcVar2 = (code *)swi(3);
            bVar6 = (basic_substring<char>)(*pcVar2)();
            return bVar6;
          }
        }
        handle_error(0x1e5106,
                     "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                     ,0x153d,"(first >= 0 && first + rnum <= len) || (num == 0)");
      }
      basic_substring(&local_20,this->str,len_);
      goto LAB_001d6f9e;
    }
    pcVar3 = this->str;
  }
  local_20.str = pcVar3;
  local_20.len = 0;
LAB_001d6f9e:
  bVar6.len = local_20.len;
  bVar6.str = local_20.str;
  return bVar6;
}

Assistant:

basic_substring trimr(ro_substr chars) const
    {
        if( ! empty())
        {
            size_t pos = last_not_of(chars, npos);
            if(pos != npos)
                return sub(0, pos+1);
        }
        return sub(0, 0);
    }